

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O0

void __thiscall covenant::DFA<covenant::Sym>::complement(DFA<covenant::Sym> *this)

{
  ulong uVar1;
  size_type sVar2;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  uint i;
  reference in_stack_ffffffffffffffe0;
  size_type __n;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    __n = in_stack_ffffffffffffffe0._M_mask;
    uVar1 = (ulong)uVar3;
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
    if (sVar2 <= uVar1) break;
    in_stack_ffffffffffffffe0 =
         std::vector<bool,_std::allocator<bool>_>::operator[]
                   ((vector<bool,_std::allocator<bool>_> *)CONCAT44(uVar3,in_stack_fffffffffffffff0)
                    ,__n);
    std::_Bit_reference::flip((_Bit_reference *)&stack0xffffffffffffffe0);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void complement()
    {
      for(unsigned int i=0; i < this->accepts.size(); i++)
      {
        this->accepts[i].flip(); 
      }
    }